

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O1

char ** parse_path(char *path)

{
  size_t sVar1;
  char *pcVar2;
  char **ppcVar3;
  char **ppcVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  long lVar8;
  char *pcVar9;
  
  sVar1 = strlen(path);
  pcVar2 = (char *)operator_new__(sVar1 + 1);
  ppcVar3 = (char **)operator_new__(-(ulong)(sVar1 + 1 >> 0x3d != 0) | sVar1 * 8 + 8);
  ppcVar4 = ppcVar3;
  pcVar5 = pcVar2;
  pcVar6 = pcVar2;
  do {
    while( true ) {
      pcVar9 = path;
      cVar7 = *pcVar9;
      if (cVar7 != '\\') break;
      cVar7 = pcVar9[1];
      path = pcVar9 + 1;
      if (cVar7 != '\0') {
        lVar8 = 2;
LAB_001d9802:
        *pcVar5 = cVar7;
        pcVar5 = pcVar5 + 1;
        path = pcVar9 + lVar8;
      }
    }
    if ((cVar7 != '/') && (cVar7 != '\0')) {
      lVar8 = 1;
      goto LAB_001d9802;
    }
    if (pcVar6 != pcVar5) {
      *pcVar5 = '\0';
      pcVar5 = pcVar5 + 1;
      *ppcVar4 = pcVar6;
      ppcVar4 = ppcVar4 + 1;
      pcVar6 = pcVar5;
    }
    path = pcVar9 + 1;
    if (*pcVar9 == '\0') {
      *ppcVar4 = (char *)0x0;
      if (ppcVar4 == ppcVar3) {
        operator_delete__(pcVar2);
      }
      return ppcVar3;
    }
  } while( true );
}

Assistant:

static char **parse_path(const char *path) {
  size_t len = strlen(path);
  char *cp = new char[(len+1)], *word = cp, *s = cp; // freed below or in free_path()
  char **ap = new char*[(len+1)], **arr = ap;	     // overallocates arr[]
  while (1) {
    if (*path =='/' || *path == 0) {		// handle path sep or eos
      if (word != s) { *s++ = 0; *arr++= word; word = s; }
      if ( !*path++) break; else continue;	// eos? done, else cont
    } else if ( *path == '\\' ) {		// handle escape
      if ( *(++path) ) { *s++ = *path++; } else continue;
    } else { *s++ = *path++; }			// handle normal char
  }
  *arr = 0;
  if ( arr == ap ) delete[] cp;	// empty arr[]? delete since free_path() can't
  return ap;
}